

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNetwork.hpp
# Opt level: O3

void __thiscall
BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork
          (BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this)

{
  ~BasicNetwork(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

BasicNetwork<Neuron, Synapse, EventManager>::~BasicNetwork()
{
    for ( auto id_ptr: neuronMap ) {
        delete id_ptr.second;
    }
    delete eventManager;
}